

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_pattern_wcs(archive_match *a,match_list *list,wchar_t *pattern)

{
  match *m;
  archive_mstring *aes;
  wchar_t *in_RDX;
  match_list *in_RSI;
  long in_RDI;
  size_t len;
  match *match;
  wchar_t *in_stack_ffffffffffffffc8;
  wchar_t local_4;
  
  m = (match *)calloc(1,0x78);
  if (m == (match *)0x0) {
    local_4 = error_nomem((archive_match *)0x11b399);
  }
  else {
    aes = (archive_mstring *)wcslen(in_RDX);
    if ((aes != (archive_mstring *)0x0) && (in_RDX[(long)&aes[-1].field_0x67] == L'/')) {
      aes = (archive_mstring *)&aes[-1].field_0x67;
    }
    archive_mstring_copy_wcs_len(aes,in_stack_ffffffffffffffc8,0x11b3f0);
    match_list_add(in_RSI,m);
    *(uint *)(in_RDI + 0x70) = *(uint *)(in_RDI + 0x70) | 1;
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
add_pattern_wcs(struct archive_match *a, struct match_list *list,
    const wchar_t *pattern)
{
	struct match *match;
	size_t len;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	/* Both "foo/" and "foo" should match "foo/bar". */
	len = wcslen(pattern);
	if (len && pattern[len - 1] == L'/')
		--len;
	archive_mstring_copy_wcs_len(&(match->pattern), pattern, len);
	match_list_add(list, match);
	a->setflag |= PATTERN_IS_SET;
	return (ARCHIVE_OK);
}